

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu.c
# Opt level: O0

void ppu_dma_write(gb_ppu_t *ppu,uint8_t value)

{
  uint8_t uVar1;
  uint16_t local_12;
  uint8_t i;
  uint8_t value_local;
  gb_ppu_t *ppu_local;
  
  if (ppu == (gb_ppu_t *)0x0) {
    __assert_fail("ppu != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/loochek[P]gameboy/src/core/ppu.c"
                  ,0x20c,"void ppu_dma_write(gb_ppu_t *, uint8_t)");
  }
  if (value < 0xe0) {
    local_12 = (ushort)value << 8;
    while ((byte)local_12 < 0xa0) {
      uVar1 = mmu_read(&ppu->gb->mmu,local_12);
      ppu->oam[(byte)local_12] = uVar1;
      local_12 = CONCAT11(local_12._1_1_,(byte)local_12 + 1);
    }
  }
  return;
}

Assistant:

void ppu_dma_write(gb_ppu_t *ppu, uint8_t value)
{
    assert(ppu != NULL);

    if (value > 0xDF)
        return;

    for (uint8_t i = 0; i < OAM_SIZE; i++)
        ppu->oam[i] = mmu_read(&ppu->gb->mmu, (value << 8) | i);
}